

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t FSE_writeNCount_generic
                 (void *header,size_t headerBufferSize,short *normalizedCounter,uint maxSymbolValue,
                 uint tableLog,uint writeIsSafe)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  undefined2 *puVar8;
  undefined2 *puVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  bool bVar19;
  
  uVar18 = maxSymbolValue + 1;
  if (uVar18 == 0) {
    return 0xffffffffffffffff;
  }
  uVar14 = tableLog - 5;
  iVar17 = 1 << ((byte)tableLog & 0x1f);
  puVar9 = (undefined2 *)((long)header + (headerBufferSize - 2));
  iVar7 = 4;
  bVar19 = false;
  uVar10 = 0;
  puVar8 = (undefined2 *)header;
  iVar11 = tableLog + 1;
  uVar3 = iVar17 + 1;
  do {
    if (bVar19) {
      uVar13 = uVar10;
      uVar5 = uVar18;
      uVar4 = uVar3;
      if ((uint)uVar10 < uVar18) {
        while (normalizedCounter[uVar13] == 0) {
          uVar13 = uVar13 + 1;
          if (uVar18 == uVar13) goto LAB_0010921a;
        }
      }
      uVar12 = (uint)uVar13;
      if (uVar12 == uVar18) {
LAB_0010921a:
        iVar11 = iVar7 + 0xe;
        if (-1 < iVar7 + 7) {
          iVar11 = iVar7 + 7;
        }
        if (uVar4 != 1) {
          return 0xffffffffffffffff;
        }
        if (uVar18 < uVar5) {
          __assert_fail("symbol <= alphabetSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x164e,
                        "size_t FSE_writeNCount_generic(void *, size_t, const short *, unsigned int, unsigned int, unsigned int)"
                       );
        }
        if ((writeIsSafe == 0) && (puVar9 < puVar8)) {
          return 0xffffffffffffffba;
        }
        *puVar8 = (short)uVar14;
        return (long)puVar8 + ((long)(iVar11 >> 3) - (long)header);
      }
      if ((uint)uVar10 + 0x18 <= uVar12) {
        uVar16 = uVar10;
        do {
          if ((writeIsSafe == 0) && (puVar9 < puVar8)) {
            return 0xffffffffffffffba;
          }
          uVar14 = uVar14 + (0xffff << ((byte)iVar7 & 0x1f));
          *puVar8 = (short)uVar14;
          puVar8 = puVar8 + 1;
          uVar14 = uVar14 >> 0x10;
          iVar2 = (int)uVar16;
          uVar5 = iVar2 + 0x18;
          uVar10 = (ulong)uVar5;
          uVar16 = (ulong)uVar5;
        } while (iVar2 + 0x30U <= uVar12);
      }
      uVar5 = (uint)uVar10;
      uVar4 = uVar5 + 3;
      while (uVar4 <= uVar12) {
        uVar14 = uVar14 + (3 << ((byte)iVar7 & 0x1f));
        iVar7 = iVar7 + 2;
        iVar2 = (int)uVar10;
        uVar5 = iVar2 + 3;
        uVar10 = (ulong)uVar5;
        uVar4 = iVar2 + 6;
      }
      uVar14 = (uVar12 - uVar5 << ((byte)iVar7 & 0x1f)) + uVar14;
      uVar10 = uVar13;
      if (iVar7 < 0xf) {
        iVar7 = iVar7 + 2;
      }
      else {
        if ((writeIsSafe == 0) && (puVar9 < puVar8)) {
          return 0xffffffffffffffba;
        }
        *puVar8 = (short)uVar14;
        puVar8 = puVar8 + 1;
        uVar14 = uVar14 >> 0x10;
        iVar7 = iVar7 + -0xe;
      }
    }
    iVar6 = (int)normalizedCounter[uVar10 & 0xffffffff];
    iVar2 = -iVar6;
    if (0 < iVar6) {
      iVar2 = iVar6;
    }
    iVar1 = ~uVar3 + iVar17 * 2;
    iVar15 = iVar1;
    if (iVar6 + 1 < iVar17) {
      iVar15 = 0;
    }
    iVar15 = iVar15 + iVar6 + 1;
    bVar19 = iVar15 == 1;
    uVar4 = uVar3 - iVar2;
    iVar6 = iVar11;
    if (uVar4 == 0 || (int)uVar3 < iVar2) {
      return 0xffffffffffffffff;
    }
    for (; (int)uVar4 < iVar17; iVar17 = iVar17 >> 1) {
      iVar6 = iVar6 + -1;
    }
    uVar14 = uVar14 + (iVar15 << ((byte)iVar7 & 0x1f));
    iVar7 = (iVar7 + iVar11) - (uint)(iVar15 < iVar1);
    if (0x10 < iVar7) {
      if (writeIsSafe == 0 && puVar9 < puVar8) {
        return 0xffffffffffffffba;
      }
      *puVar8 = (short)uVar14;
      puVar8 = puVar8 + 1;
      uVar14 = uVar14 >> 0x10;
      iVar7 = iVar7 + -0x10;
    }
    uVar5 = (int)uVar10 + 1;
    if ((uVar18 <= uVar5) || (uVar10 = (ulong)uVar5, iVar11 = iVar6, uVar3 = uVar4, uVar4 == 1))
    goto LAB_0010921a;
  } while( true );
}

Assistant:

static size_t
FSE_writeNCount_generic (void* header, size_t headerBufferSize,
                   const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog,
                         unsigned writeIsSafe)
{
    BYTE* const ostart = (BYTE*) header;
    BYTE* out = ostart;
    BYTE* const oend = ostart + headerBufferSize;
    int nbBits;
    const int tableSize = 1 << tableLog;
    int remaining;
    int threshold;
    U32 bitStream = 0;
    int bitCount = 0;
    unsigned symbol = 0;
    unsigned const alphabetSize = maxSymbolValue + 1;
    int previousIs0 = 0;

    /* Table Size */
    bitStream += (tableLog-FSE_MIN_TABLELOG) << bitCount;
    bitCount  += 4;

    /* Init */
    remaining = tableSize+1;   /* +1 for extra accuracy */
    threshold = tableSize;
    nbBits = tableLog+1;

    while ((symbol < alphabetSize) && (remaining>1)) {  /* stops at 1 */
        if (previousIs0) {
            unsigned start = symbol;
            while ((symbol < alphabetSize) && !normalizedCounter[symbol]) symbol++;
            if (symbol == alphabetSize) break;   /* incorrect distribution */
            while (symbol >= start+24) {
                start+=24;
                bitStream += 0xFFFFU << bitCount;
                if ((!writeIsSafe) && (out > oend-2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE) bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out+=2;
                bitStream>>=16;
            }
            while (symbol >= start+3) {
                start+=3;
                bitStream += 3 << bitCount;
                bitCount += 2;
            }
            bitStream += (symbol-start) << bitCount;
            bitCount += 2;
            if (bitCount>16) {
                if ((!writeIsSafe) && (out > oend - 2))
                    return ERROR(dstSize_tooSmall);   /* Buffer overflow */
                out[0] = (BYTE)bitStream;
                out[1] = (BYTE)(bitStream>>8);
                out += 2;
                bitStream >>= 16;
                bitCount -= 16;
        }   }
        {   int count = normalizedCounter[symbol++];
            int const max = (2*threshold-1) - remaining;
            remaining -= count < 0 ? -count : count;
            count++;   /* +1 for extra accuracy */
            if (count>=threshold)
                count += max;   /* [0..max[ [max..threshold[ (...) [threshold+max 2*threshold[ */
            bitStream += count << bitCount;
            bitCount  += nbBits;
            bitCount  -= (count<max);
            previousIs0  = (count==1);
            if (remaining<1) return ERROR(GENERIC);
            while (remaining<threshold) { nbBits--; threshold>>=1; }
        }
        if (bitCount>16) {
            if ((!writeIsSafe) && (out > oend - 2))
                return ERROR(dstSize_tooSmall);   /* Buffer overflow */
            out[0] = (BYTE)bitStream;
            out[1] = (BYTE)(bitStream>>8);
            out += 2;
            bitStream >>= 16;
            bitCount -= 16;
    }   }

    if (remaining != 1)
        return ERROR(GENERIC);  /* incorrect normalized distribution */
    assert(symbol <= alphabetSize);

    /* flush remaining bitStream */
    if ((!writeIsSafe) && (out > oend - 2))
        return ERROR(dstSize_tooSmall);   /* Buffer overflow */
    out[0] = (BYTE)bitStream;
    out[1] = (BYTE)(bitStream>>8);
    out+= (bitCount+7) /8;

    return (out-ostart);
}